

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cones.h
# Opt level: O2

void __thiscall
mp::
ConicConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::WarnOnMix(ConicConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
            *this)

{
  bool bVar1;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  bVar1 = HasAnyCones(this);
  if (bVar1) {
    this_00 = &((this->
                super_MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                ).mc_)->
               super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ;
    if (this_00->nQC2SOCPAttempted_ <= this_00->nQC2SOCPSucceeded_) {
      bVar1 = FlatModel<mp::DefaultFlatModelParams>::HasQPObjective
                        (&this_00->super_FlatModel<mp::DefaultFlatModelParams>);
      if (!bVar1) {
        return;
      }
      this_00 = &((this->
                  super_MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                  ).mc_)->
                 super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      ;
    }
    if (this_00->ifCvtSOCP2QC_ == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,"Mix QC+cones",&local_51);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,
                 "Not all quadratic constraints could be recognized\nas quadratic cones; or, the objective is quadratic;\nadditionally, further conversion back to QC\nnot desired (option cvt:socp2qc) or other cone types present;\nsolver might not accept the model.\nTry to express all cones in standard forms,\nnot in the objective.\nSee mp.ampl.com/modeling-expressions.html#conic-optimization."
                 ,&local_52);
      FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      ::AddWarning(this_00,&local_30,&local_50,false);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
    }
  }
  return;
}

Assistant:

void WarnOnMix() {
    if ( !MC().ModelAPICanMixConicQCAndQC()) {  // cannot mix
      if ((HasAnyCones()                        // exp cones
           && (MC().NumQC2SOCPAttempted() > MC().NumQC2SOCPSucceeded()
               || MC().HasQPObjective()))       // and quadratics left in
           && !MC().IfConvertSOCP2QC()          // and not decided to convert
          ) {
        MC().AddWarning("Mix QC+cones",
                        "Not all quadratic constraints could "
                        "be recognized\nas quadratic cones; "
                        "or, the objective is quadratic;\n"
                        "additionally, further conversion back to QC\n"
                        "not desired (option cvt:socp2qc) or other cone types present;\n"
                        "solver might not accept the model.\n"
                        "Try to express all cones in standard forms,\n"
                        "not in the objective.\n"
                        "See mp.ampl.com/modeling-expressions.html#conic-optimization.");
      }
    }
  }